

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

uint __thiscall cnn::Cluster::sample(Cluster *this,Expression *h,ComputationGraph *cg)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  long in_RDI;
  real rVar4;
  real rVar5;
  float fVar6;
  double p_1;
  uint c;
  vector<float,_std::allocator<float>_> dist;
  double p;
  double prob0;
  Expression *in_stack_fffffffffffffef8;
  Expression *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  Tensor *in_stack_ffffffffffffff38;
  uint local_ac;
  vector<float,_std::allocator<float>_> local_a8;
  ComputationGraph *in_stack_ffffffffffffff78;
  Expression *in_stack_ffffffffffffff80;
  Cluster *in_stack_ffffffffffffff88;
  uint local_4;
  
  if (*(int *)(in_RDI + 0xb4) == 1) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0xb4) == 2) {
    cnn::expr::Expression::Expression(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    predict(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    cnn::expr::logistic((Expression *)in_stack_ffffffffffffff38);
    ComputationGraph::incremental_forward((ComputationGraph *)0x5e9fc2);
    rVar4 = as_scalar((Tensor *)0x5e9fca);
    rVar5 = rand01();
    if (rVar4 <= rVar5) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    this_00 = (vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff80;
    cnn::expr::Expression::Expression(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    predict(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    cnn::expr::softmax((Expression *)in_stack_ffffffffffffff38);
    ComputationGraph::incremental_forward((ComputationGraph *)0x5ea078);
    as_vector(in_stack_ffffffffffffff38);
    local_ac = 0;
    fVar6 = rand01();
    for (; sVar1 = std::vector<float,_std::allocator<float>_>::size(&local_a8), local_ac < sVar1;
        local_ac = local_ac + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_a8,(ulong)local_ac);
      fVar6 = fVar6 - *pvVar2;
      if (fVar6 < 0.0) break;
    }
    uVar3 = (ulong)local_ac;
    sVar1 = std::vector<float,_std::allocator<float>_>::size(&local_a8);
    if (uVar3 == sVar1) {
      local_ac = local_ac - 1;
    }
    local_4 = local_ac;
    std::vector<float,_std::allocator<float>_>::~vector(this_00);
  }
  return local_4;
}

Assistant:

unsigned Cluster::sample(expr::Expression h, ComputationGraph& cg) const {
  if (output_size == 1) {
    return 0;
  }
  else if (output_size == 2) {
    logistic(predict(h, cg));
    double prob0 = as_scalar(cg.incremental_forward());
    double p = rand01();
    if (p < prob0) {
      return 0;
    }
    else {
      return 1;
    }
  }
  else {
    softmax(predict(h, cg));
    vector<float> dist = as_vector(cg.incremental_forward());
    unsigned c = 0;
    double p = rand01();
    for (; c < dist.size(); ++c) {
      p -= dist[c];
      if (p < 0.0) { break; }
    }
    if (c == dist.size()) {
      --c;
    }
    return c;
  }
}